

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

SpectrumHandle __thiscall
pbrt::ParameterDictionary::GetOneSpectrum
          (ParameterDictionary *this,string *name,SpectrumHandle *defaultValue,
          SpectrumType spectrumType,Allocator alloc)

{
  long lVar1;
  ParsedParameter *param;
  size_t __n;
  int iVar2;
  undefined4 in_register_0000000c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Allocator in_R9;
  int iVar4;
  long lVar5;
  bool bVar6;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> s;
  memory_resource *local_80;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> local_48;
  
  lVar1 = *(long *)((long)&name[2].field_2 + 8);
  paVar3 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)name->_M_string_length;
  }
  local_80 = (this->params).alloc.memoryResource;
  bVar6 = lVar1 == 0;
  if (!bVar6) {
    lVar5 = 0;
    do {
      param = *(ParsedParameter **)((long)paVar3 + lVar5);
      __n = (param->name)._M_string_length;
      iVar4 = 3;
      if ((__n == defaultValue[1].
                  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                  .bits) &&
         ((__n == 0 ||
          (iVar2 = bcmp((param->name)._M_dataplus._M_p,
                        (void *)(defaultValue->
                                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                                ).bits,__n), iVar2 == 0)))) {
        extractSpectrumArray
                  (&local_48,(ParameterDictionary *)name,param,(SpectrumType)alloc.memoryResource,
                   in_R9);
        if (local_48.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_48.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar4 = 0;
        }
        else {
          if (8 < (ulong)((long)local_48.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_48.
                               super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
            (this->params).alloc.memoryResource = local_80;
            ErrorExit<std::__cxx11::string_const&>
                      (&param->loc,"More than one value provided for parameter \"%s\".",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       defaultValue);
          }
          local_80 = (memory_resource *)
                     ((local_48.
                       super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                     ).bits;
          iVar4 = 1;
        }
        if (local_48.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((iVar4 != 3) && (iVar4 != 0)) {
        (this->params).alloc.memoryResource = local_80;
        if (!bVar6) {
          return (SpectrumHandle)this;
        }
        goto LAB_001f62a5;
      }
      lVar5 = lVar5 + 8;
      bVar6 = lVar1 << 3 == lVar5;
    } while (!bVar6);
  }
  (this->params).alloc.memoryResource = local_80;
LAB_001f62a5:
  (this->params).alloc.memoryResource = (memory_resource *)0x0;
  (this->params).alloc.memoryResource =
       *(memory_resource **)CONCAT44(in_register_0000000c,spectrumType);
  return (SpectrumHandle)this;
}

Assistant:

SpectrumHandle ParameterDictionary::GetOneSpectrum(const std::string &name,
                                                   SpectrumHandle defaultValue,
                                                   SpectrumType spectrumType,
                                                   Allocator alloc) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name)
            continue;

        std::vector<SpectrumHandle> s = extractSpectrumArray(*p, spectrumType, alloc);
        if (!s.empty()) {
            if (s.size() > 1)
                ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                          name);
            return s[0];
        }
    }

    return defaultValue;
}